

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerTriangles.cpp
# Opt level: O0

RGB __thiscall
RayTracerTriangles::processPixel(RayTracerTriangles *this,Segment *ray,int recursionLevel)

{
  KdNode *this_00;
  Segment seg;
  RGB RVar1;
  float t_enter;
  float t_exit;
  RGB local_124;
  Triangle local_120;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  FindResult local_c4;
  undefined1 local_74 [8];
  FindResult triangleIntersec;
  int recursionLevel_local;
  Segment *ray_local;
  RayTracerTriangles *this_local;
  
  triangleIntersec.point.y = (float)recursionLevel;
  unique0x1000020e = ray;
  FindResult::FindResult((FindResult *)local_74);
  if (this->kdTree != (KdNode *)0x0) {
    this_00 = this->kdTree;
    local_e0._0_4_ = (stack0xffffffffffffffe0->a).x;
    local_e0._4_4_ = (stack0xffffffffffffffe0->a).y;
    local_d8 = *(undefined8 *)&(stack0xffffffffffffffe0->a).z;
    local_d0._0_4_ = (stack0xffffffffffffffe0->b).y;
    local_d0._4_4_ = (stack0xffffffffffffffe0->b).z;
    local_120.x.x = 0.0;
    local_120.x.y = 0.0;
    local_120.x.z = 0.0;
    local_120.y.x = 0.0;
    local_120.y.y = 0.0;
    local_120.y.z = 0.0;
    local_120.z.x = 0.0;
    local_120.z.y = 0.0;
    local_120.z.z = 0.0;
    local_120.colorX.r = '\0';
    local_120.colorX.g = '\0';
    local_120.colorX.b = '\0';
    local_120.colorY.r = '\0';
    local_120.colorY.g = '\0';
    local_120.colorY.b = '\0';
    local_120.colorZ.r = '\0';
    local_120.colorZ.g = '\0';
    local_120.colorZ.b = '\0';
    local_120.normal.x = 0.0;
    local_120.normal.y = 0.0;
    local_120.normal.z = 0.0;
    local_120.reflectionCoefficient = 0.1;
    t_enter = std::numeric_limits<float>::min();
    t_exit = std::numeric_limits<float>::max();
    seg.a.z = (float)(undefined4)local_d8;
    seg.b.x = (float)local_d8._4_4_;
    seg.a.x = (float)(undefined4)local_e0;
    seg.a.y = (float)local_e0._4_4_;
    seg.b.y = (float)(undefined4)local_d0;
    seg.b.z = (float)local_d0._4_4_;
    KdNode::find(&local_c4,this_00,seg,&local_120,0,t_enter,t_exit);
    memcpy(local_74,&local_c4,0x50);
  }
  if ((local_74[0] & 1U) == 0) {
    RVar1 = processPixelOnBackground(this);
    this_local._5_2_ = RVar1._0_2_;
    this_local._7_1_ = RVar1.b;
  }
  else {
    RVar1 = processPixelOnTriangle
                      (this,&stack0xffffffffffffffe0->a,(Point *)&triangleIntersec.triangle.normal.z
                       ,(Triangle *)(local_74 + 4),(int)triangleIntersec.point.y);
    this_local._5_2_ = RVar1._0_2_;
    this_local._7_1_ = RVar1.b;
  }
  local_124.b = this_local._7_1_;
  local_124.r = this_local._5_1_;
  local_124.g = this_local._6_1_;
  return local_124;
}

Assistant:

RGB RayTracerTriangles::processPixel(Segment const& ray, int recursionLevel)
{
  FindResult triangleIntersec;
  if (kdTree != nullptr)
    triangleIntersec = kdTree->find(ray, Triangle{{0, 0, 0}, {0, 0, 0}, {0, 0, 0}}, 0, std::numeric_limits<float>::min(), std::numeric_limits<float>::max());
  if (triangleIntersec.exists == false)
    return processPixelOnBackground();

  return processPixelOnTriangle(ray.a, triangleIntersec.point, triangleIntersec.triangle,
                                recursionLevel);
}